

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O3

string * __thiscall
re2::FormatCapture_abi_cxx11_
          (string *__return_storage_ptr__,re2 *this,StringPiece *text,StringPiece *s)

{
  string *psVar1;
  string *extraout_RAX;
  
  if (text != (StringPiece *)0x0) {
    psVar1 = StringPrintf_abi_cxx11_
                       (__return_storage_ptr__,"(%d,%d)",(ulong)(uint)((int)text - (int)this),
                        (ulong)(uint)(((int)s + (int)text) - (int)this));
    return psVar1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(?,?)","");
  return extraout_RAX;
}

Assistant:

static string FormatCapture(const StringPiece& text, const StringPiece& s) {
  if (s.begin() == NULL)
    return "(?,?)";
  return StringPrintf("(%d,%d)",
                      static_cast<int>(s.begin() - text.begin()),
                      static_cast<int>(s.end() - text.begin()));
}